

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void number_suite::test_uint64(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  writer writer;
  size_type local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined4 local_7c;
  type local_78;
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  local_68;
  
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78.__align,&local_98);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::overloader<unsigned_long,_void>::value
                       ((basic_writer<16UL> *)&local_78.__align,0x7fffffffffffffff);
  local_7c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(std::uint64_t(UINT64_C(0x7FFFFFFFFFFFFFFF)))","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xcd,"void number_suite::test_uint64()",&local_a0,&local_7c);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::overloader<unsigned_long,_void>::value
                       ((basic_writer<16UL> *)&local_78.__align,0x8000000000000000);
  local_7c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(std::uint64_t(UINT64_C(0x8000000000000000)))","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xce,"void number_suite::test_uint64()",&local_a0,&local_7c);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::overloader<unsigned_long,_void>::value
                       ((basic_writer<16UL> *)&local_78.__align,0xffffffffffffffff);
  local_7c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(std::uint64_t(UINT64_C(0xFFFFFFFFFFFFFFFF)))","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xcf,"void number_suite::test_uint64()",&local_a0,&local_7c);
  local_a0 = (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_7c = 0x1b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","27",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd0,"void number_suite::test_uint64()",&local_a0,&local_7c);
  local_a0._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd1,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd2,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[2]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd3,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 2,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[3]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd4,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 3,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[4]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd5,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[5]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd6,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 5,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[6]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd7,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 6,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[7]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd8,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 7,&local_a0);
  local_a0._0_4_ = 0x7f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[8]","0x7F",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xd9,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 8,&local_a0);
  local_a0._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[9]","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xda,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 9,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[10]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xdb,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 10,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[11]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xdc,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xb,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[12]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xdd,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xc,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[13]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xde,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xd,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[14]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xdf,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xe,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[15]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe0,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xf,&local_a0);
  local_a0._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[16]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe1,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x10,&local_a0);
  local_a0._0_4_ = 0x80;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[17]","0x80",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe2,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x11,&local_a0);
  local_a0._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[18]","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe3,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x12,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[19]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe4,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x13,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[20]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe5,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x14,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[21]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe6,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x15,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[22]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe7,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x16,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[23]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe8,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x17,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[24]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xe9,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x18,&local_a0);
  local_a0._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[25]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xea,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x19,&local_a0);
  local_a0 = CONCAT44(local_a0._4_4_,0xff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[26]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0xeb,"void number_suite::test_uint64()",
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x1a,&local_a0);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base(&local_68);
  (**(code **)local_78._0_8_)(&local_78);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}